

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  FILE *__stream;
  runtime_error *this;
  long in_RSI;
  int in_EDI;
  double dVar4;
  int c;
  int x;
  int y;
  int z;
  int maxc;
  float *ptr;
  int i;
  FILE *f;
  int l;
  float *out;
  size_t bufsize;
  int k;
  float *scale;
  int nThreads;
  int res;
  Gamut gamut;
  pointer in_stack_ffffffffffffff18;
  unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  undefined4 in_stack_ffffffffffffff38;
  int iVar6;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar7;
  int local_c0;
  int local_bc;
  float *local_b8;
  int local_ac;
  char *in_stack_ffffffffffffff68;
  _Any_data *func;
  void **end;
  undefined8 in_stack_ffffffffffffff80;
  Gamut gamut_00;
  int *start;
  anon_class_32_4_fd0211fd local_70;
  int local_4c;
  float *local_48;
  ulong local_40;
  int local_34;
  void *local_30 [2];
  int local_1c;
  _Any_data local_18;
  int local_4;
  
  gamut_00 = (Gamut)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_4 = 0;
  if (in_EDI < 3) {
    printf(
          "Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\nwhere <gamut> is one of sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020\n"
          );
    exit(-1);
  }
  local_18._4_4_ = SRGB;
  local_18._8_8_ = in_RSI;
  if (3 < in_EDI) {
    local_18._4_4_ = parse_gamut((char *)in_stack_ffffffffffffff18);
  }
  if (local_18._4_4_ == NO_GAMUT) {
    fprintf(_stderr,"Could not parse gamut `%s\'!\n",*(undefined8 *)(local_18._8_8_ + 0x18));
    exit(-1);
  }
  init_tables(gamut_00);
  local_18._0_4_ = atoi(*(char **)(local_18._8_8_ + 8));
  if (local_18._0_4_ == 0) {
    printf("Invalid resolution!\n");
    exit(-1);
  }
  local_1c = AvailableCores();
  std::make_unique<ThreadPool,int&>
            ((int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::operator=
            (in_stack_ffffffffffffff20,
             (unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *)in_stack_ffffffffffffff18);
  std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::~unique_ptr
            (in_stack_ffffffffffffff20);
  printf("Optimizing %s spectra...\n",*(undefined8 *)(local_18._8_8_ + 0x18));
  fflush(_stdout);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_18._0_4_;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_30[0] = operator_new__(uVar3);
  for (local_34 = 0; local_34 < (int)local_18._0_4_; local_34 = local_34 + 1) {
    dVar4 = smoothstep((double)local_34 / (double)(int)(local_18._0_4_ - 1));
    dVar4 = smoothstep(dVar4);
    *(float *)((long)local_30[0] + (long)local_34 * 4) = (float)dVar4;
  }
  local_40 = (ulong)(local_18._0_4_ * 9 * local_18._0_4_ * local_18._0_4_);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_40;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_48 = (float *)operator_new__(uVar3);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    in_stack_ffffffffffffff20 =
         (unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *)(long)(int)local_18._0_4_;
    func = &local_18;
    end = local_30;
    start = &local_4c;
    std::function<void(long)>::function<main::__0,void>
              ((function<void_(long)> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),&local_70);
    ParallelFor((int64_t)start,(int64_t)end,(function<void_(long)> *)func,in_stack_ffffffffffffff68)
    ;
    std::function<void_(long)>::~function((function<void_(long)> *)0x10a20d);
  }
  __stream = fopen(*(char **)(local_18._8_8_ + 0x10),"w");
  if (__stream == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not create file!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fprintf(__stream,"namespace pbrt {\n");
  fprintf(__stream,"extern const int %sToSpectrumTable_Res = %d;\n",
          *(undefined8 *)(local_18._8_8_ + 0x18),(ulong)(uint)local_18._0_4_);
  fprintf(__stream,"extern const float %sToSpectrumTable_Scale[%d] = {\n",
          *(undefined8 *)(local_18._8_8_ + 0x18),(ulong)(uint)local_18._0_4_);
  for (local_ac = 0; local_ac < (int)local_18._0_4_; local_ac = local_ac + 1) {
    fprintf(__stream,"%.9g, ",(double)*(float *)((long)local_30[0] + (long)local_ac * 4));
  }
  fprintf(__stream,"};\n");
  fprintf(__stream,"extern const float %sToSpectrumTable_Data[3][%d][%d][%d][3] = {\n",
          *(undefined8 *)(local_18._8_8_ + 0x18),(ulong)(uint)local_18._0_4_,
          (ulong)(uint)local_18._0_4_,(ulong)(uint)local_18._0_4_);
  local_b8 = local_48;
  for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
    fprintf(__stream,"{ ");
    for (local_c0 = 0; local_c0 < (int)local_18._0_4_; local_c0 = local_c0 + 1) {
      fprintf(__stream,"{ ");
      for (iVar7 = 0; iVar7 < (int)local_18._0_4_; iVar7 = iVar7 + 1) {
        fprintf(__stream,"{ ");
        for (iVar6 = 0; iVar6 < (int)local_18._0_4_; iVar6 = iVar6 + 1) {
          fprintf(__stream,"{ ");
          for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
            fprintf(__stream,"%.9g, ",(double)*local_b8);
            local_b8 = local_b8 + 1;
          }
          fprintf(__stream,"}, ");
        }
        fprintf(__stream,"},\n    ");
      }
      fprintf(__stream,"}, ");
    }
    fprintf(__stream,"}, ");
  }
  fprintf(__stream,"};\n");
  fprintf(__stream,"} // namespace pbrt\n");
  fclose(__stream);
  std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::reset
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 3) {
        printf("Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\n"
               "where <gamut> is one of "
               "sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020\n");
        exit(-1);
    }
    Gamut gamut = SRGB;
    if (argc > 3)
        gamut = parse_gamut(argv[3]);
    if (gamut == NO_GAMUT) {
        fprintf(stderr, "Could not parse gamut `%s'!\n", argv[3]);
        exit(-1);
    }
    init_tables(gamut);

    const int res = atoi(argv[1]);
    if (res == 0) {
        printf("Invalid resolution!\n");
        exit(-1);
    }

    int nThreads = AvailableCores();
    threadPool = std::make_unique<ThreadPool>(nThreads);

    printf("Optimizing %s spectra...\n", argv[3]);
    fflush(stdout);

    float *scale = new float[res];
    for (int k = 0; k < res; ++k)
        scale[k] = (float)smoothstep(smoothstep(k / double(res - 1)));

    size_t bufsize = 3 * 3 * res * res * res;
    float *out = new float[bufsize];

    for (int l = 0; l < 3; ++l) {
        ParallelFor(0, res, [&](size_t j) {
            const double y = j / double(res - 1);
            fflush(stdout);
            for (int i = 0; i < res; ++i) {
                const double x = i / double(res - 1);
                double coeffs[3], rgb[3];
                memset(coeffs, 0, sizeof(double) * 3);

                int start = res / 5;

                for (int k = start; k < res; ++k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    gauss_newton(rgb, coeffs);

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }

                memset(coeffs, 0, sizeof(double) * 3);
                for (int k = start; k >= 0; --k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    gauss_newton(rgb, coeffs);

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }
            }
        });
    }

    FILE *f = fopen(argv[2], "w");
    if (f == nullptr)
        throw std::runtime_error("Could not create file!");
    fprintf(f, "namespace pbrt {\n");
    fprintf(f, "extern const int %sToSpectrumTable_Res = %d;\n", argv[3], res);
    fprintf(f, "extern const float %sToSpectrumTable_Scale[%d] = {\n", argv[3], res);
    for (int i = 0; i < res; ++i)
        fprintf(f, "%.9g, ", scale[i]);
    fprintf(f, "};\n");
    fprintf(f, "extern const float %sToSpectrumTable_Data[3][%d][%d][%d][3] = {\n",
            argv[3], res, res, res);
    const float *ptr = out;
    for (int maxc = 0; maxc < 3; ++maxc) {
        fprintf(f, "{ ");
        for (int z = 0; z < res; ++z) {
            fprintf(f, "{ ");
            for (int y = 0; y < res; ++y) {
                fprintf(f, "{ ");
                for (int x = 0; x < res; ++x) {
                    fprintf(f, "{ ");
                    for (int c = 0; c < 3; ++c)
                        fprintf(f, "%.9g, ", *ptr++);
                    fprintf(f, "}, ");
                }
                fprintf(f, "},\n    ");
            }
            fprintf(f, "}, ");
        }
        fprintf(f, "}, ");
    }
    fprintf(f, "};\n");
    fprintf(f, "} // namespace pbrt\n");
    fclose(f);

    threadPool.reset();
}